

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

void __thiscall
GlobalSimpleStringMemoryAccountant::restoreAllocator(GlobalSimpleStringMemoryAccountant *this)

{
  AccountingTestMemoryAllocator *pAVar1;
  AccountingTestMemoryAllocator *this_00;
  
  this_00 = this->allocator_;
  if (this_00 != (AccountingTestMemoryAllocator *)0x0) {
    pAVar1 = (AccountingTestMemoryAllocator *)SimpleString::stringAllocator_;
    if (SimpleString::stringAllocator_ == (TestMemoryAllocator *)0x0) {
      pAVar1 = (AccountingTestMemoryAllocator *)defaultNewArrayAllocator();
      this_00 = this->allocator_;
    }
    if (pAVar1 == this_00) {
      SimpleString::stringAllocator_ = AccountingTestMemoryAllocator::originalAllocator(this_00);
    }
  }
  return;
}

Assistant:

void GlobalSimpleStringMemoryAccountant::restoreAllocator()
{
    if (allocator_ && (SimpleString::getStringAllocator() == allocator_))
        SimpleString::setStringAllocator(allocator_->originalAllocator());
}